

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool ON_NurbsArcToArcTransitionIsNotGsmooth
               (ON_NurbsCurve *nurbs_curve,int knot_index,double cos_angle_tolerance,
               double curvature_tolerance)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  bool bVar4;
  int iVar5;
  int i;
  ulong uVar6;
  ON_Plane *pOVar7;
  ON_Arc *pOVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  ON_NurbsCurve span;
  ON_Arc arc1;
  ON_Arc arc0;
  ON_NurbsCurve local_198;
  ON_Arc local_158;
  ON_Arc local_c0;
  
  uVar6 = (ulong)(uint)knot_index;
  bVar11 = 0;
  if (nurbs_curve->m_is_rat == 0) {
    return false;
  }
  iVar2 = nurbs_curve->m_order;
  if ((long)iVar2 < 3) {
    return false;
  }
  iVar5 = nurbs_curve->m_cv_count;
  if (iVar5 <= iVar2) {
    return false;
  }
  if (0 < knot_index) {
    uVar6 = (ulong)(uint)knot_index;
    do {
      dVar1 = nurbs_curve->m_knot[uVar6 - 1];
      pdVar3 = nurbs_curve->m_knot + uVar6;
      if ((dVar1 != *pdVar3) || (NAN(dVar1) || NAN(*pdVar3))) goto LAB_005919d0;
      bVar4 = 1 < (long)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar4);
    uVar6 = 0;
  }
LAB_005919d0:
  i = (int)uVar6;
  if (i <= iVar2 + -2) {
    return false;
  }
  if (iVar5 + -1 <= i) {
    return false;
  }
  pdVar3 = nurbs_curve->m_knot;
  lVar10 = (long)i;
  dVar1 = pdVar3[lVar10];
  if (dVar1 < pdVar3[(long)iVar2 + -2] || dVar1 == pdVar3[(long)iVar2 + -2]) {
    return false;
  }
  if (pdVar3[(long)iVar5 + -1] <= dVar1) {
    return false;
  }
  iVar5 = i + iVar2;
  if (dVar1 != pdVar3[(long)iVar5 + -2]) {
    return false;
  }
  if (NAN(dVar1) || NAN(pdVar3[(long)iVar5 + -2])) {
    return false;
  }
  if (pdVar3[(long)(i - iVar2) + 1] != pdVar3[i + -1]) {
    return false;
  }
  if (NAN(pdVar3[(long)(i - iVar2) + 1]) || NAN(pdVar3[i + -1])) {
    return false;
  }
  if (pdVar3[(long)iVar5 + -1] != pdVar3[(long)(iVar2 + iVar5 + -1) + -2]) {
    return false;
  }
  if (NAN(pdVar3[(long)iVar5 + -1]) || NAN(pdVar3[(long)(iVar2 + iVar5 + -1) + -2])) {
    return false;
  }
  dVar1 = ON_NurbsCurve::Weight(nurbs_curve,i);
  if (dVar1 != 1.0) {
    return false;
  }
  if (NAN(dVar1)) {
    return false;
  }
  lVar9 = (long)(i - iVar2) + 1;
  ON_NurbsCurve::ON_NurbsCurve(&local_198);
  local_198.m_dim = nurbs_curve->m_dim;
  local_198.m_is_rat = nurbs_curve->m_is_rat;
  local_198.m_order = nurbs_curve->m_order;
  local_198.m_cv_stride = nurbs_curve->m_cv_stride;
  local_198.m_knot = nurbs_curve->m_knot + lVar9;
  local_198.m_cv = nurbs_curve->m_cv + (int)lVar9 * local_198.m_cv_stride;
  pOVar7 = &ON_Plane::World_xy;
  pOVar8 = &local_c0;
  for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pOVar8->super_ON_Circle).plane.origin.x = (pOVar7->origin).x;
    pOVar7 = (ON_Plane *)((long)pOVar7 + ((ulong)bVar11 * -2 + 1) * 8);
    pOVar8 = (ON_Arc *)((long)pOVar8 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  local_c0.super_ON_Circle.radius = 1.0;
  local_c0.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  local_c0.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
  local_198.m_cv_count = local_198.m_order;
  bVar4 = ON_NurbsCurve::IsLinear(&local_198,2.3283064365386963e-10);
  if ((!bVar4) &&
     (bVar4 = ON_NurbsCurve::IsArc(&local_198,(ON_Plane *)0x0,&local_c0,2.3283064365386963e-10),
     bVar4)) {
    pOVar7 = &ON_Plane::World_xy;
    pOVar8 = &local_158;
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pOVar8->super_ON_Circle).plane.origin.x = (pOVar7->origin).x;
      pOVar7 = (ON_Plane *)((long)pOVar7 + ((ulong)bVar11 * -2 + 1) * 8);
      pOVar8 = (ON_Arc *)((long)pOVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    }
    local_158.super_ON_Circle.radius = 1.0;
    local_158.m_angle.m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
    local_158.m_angle.m_t[1] = ON_Interval::ZeroToTwoPi.m_t[1];
    local_198.m_knot = nurbs_curve->m_knot + lVar10;
    local_198.m_cv = nurbs_curve->m_cv + nurbs_curve->m_cv_stride * lVar10;
    bVar4 = ON_NurbsCurve::IsLinear(&local_198,2.3283064365386963e-10);
    if (((!bVar4) &&
        (bVar4 = ON_NurbsCurve::IsArc
                           (&local_198,(ON_Plane *)&local_c0,&local_158,2.3283064365386963e-10),
        bVar4)) &&
       (bVar4 = ON_ArcToArcTransitionIsNotGsmooth
                          (&local_c0,&local_158,cos_angle_tolerance,curvature_tolerance), bVar4)) {
      ON_Plane::~ON_Plane((ON_Plane *)&local_158);
      bVar4 = true;
      goto LAB_00591c3e;
    }
    ON_Plane::~ON_Plane((ON_Plane *)&local_158);
  }
  bVar4 = false;
  local_198.m_knot = (double *)0x0;
  local_198.m_cv = (double *)0x0;
LAB_00591c3e:
  ON_Plane::~ON_Plane((ON_Plane *)&local_c0);
  ON_NurbsCurve::~ON_NurbsCurve(&local_198);
  return bVar4;
}

Assistant:

static bool ON_NurbsArcToArcTransitionIsNotGsmooth(
  const ON_NurbsCurve& nurbs_curve,
  int knot_index,
  double cos_angle_tolerance,
  double curvature_tolerance
  )
{
  if ( 0 == nurbs_curve.m_is_rat )
    return false;
  if ( nurbs_curve.m_order < 3 )
    return false;
  if ( nurbs_curve.m_cv_count <= nurbs_curve.m_order )
    return false;
  while ( knot_index > 0 && nurbs_curve.m_knot[knot_index-1] == nurbs_curve.m_knot[knot_index] )
    knot_index--;
  if ( knot_index <= nurbs_curve.m_order-2 )
    return false;
  if ( knot_index >= nurbs_curve.m_cv_count-1 )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] > nurbs_curve.m_knot[nurbs_curve.m_order-2]) )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] < nurbs_curve.m_knot[nurbs_curve.m_cv_count-1]) )
    return false;
  if ( !(nurbs_curve.m_knot[knot_index] == nurbs_curve.m_knot[knot_index+nurbs_curve.m_order-2]) )
    return false;
  int k0 = knot_index-nurbs_curve.m_order+1;
  if ( !(nurbs_curve.m_knot[k0] == nurbs_curve.m_knot[k0+nurbs_curve.m_order-2]) )
    return false;
  int k1 = knot_index+nurbs_curve.m_order-1;
  if ( !(nurbs_curve.m_knot[k1] == nurbs_curve.m_knot[k1+nurbs_curve.m_order-2]) )
    return false;
  if ( !(1.0 == nurbs_curve.Weight(knot_index)) )
    return false;

  ON_NurbsCurve span;
  span.m_dim = nurbs_curve.m_dim;
  span.m_is_rat = nurbs_curve.m_is_rat;
  span.m_order = nurbs_curve.m_order;
  span.m_cv_count = nurbs_curve.m_order; // no typo here, I want m_cv_count = nurbs_curve.m_order
  span.m_cv_stride = nurbs_curve.m_cv_stride;
  span.m_knot = nurbs_curve.m_knot + k0;
  span.m_cv = nurbs_curve.m_cv + k0*nurbs_curve.m_cv_stride;

  bool rc = false;
  ON_Arc arc0;
  if ( !span.IsLinear(ON_ZERO_TOLERANCE) && span.IsArc(0,&arc0) )
  {
    ON_Arc arc1;
    span.m_knot = nurbs_curve.m_knot + knot_index;
    span.m_cv = nurbs_curve.m_cv + knot_index*nurbs_curve.m_cv_stride;
    if ( !span.IsLinear(ON_ZERO_TOLERANCE) && span.IsArc(&arc0.plane,&arc1) )
    {
      if ( ON_ArcToArcTransitionIsNotGsmooth(arc0,arc1,cos_angle_tolerance,curvature_tolerance) )
        return true;
    }
  }

  span.m_knot = 0;
  span.m_cv = 0;

  return rc;
}